

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:1089:34)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:1089:34)>
             *this)

{
  atomic<unsigned_int> *paVar1;
  undefined1 local_240 [32];
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  Promise<siginfo_t> local_90 [16];
  
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  paVar1 = (this->f).readyCount;
  LOCK();
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  UnixEventPort::onSignal((UnixEventPort *)local_240,(int)&port);
  local_240._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_240._16_8_ = "operator()";
  local_240._24_8_ = (_func_int **)0x700000447;
  Promise<siginfo_t>::wait(local_90,local_240);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_240);
  paVar1 = (this->f).doneCount;
  LOCK();
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }